

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O3

void __thiscall Command::Command(Command *this,string *cmd,char *extraArgs)

{
  pointer pcVar1;
  allocator<char> local_19;
  
  (this->cmd_id_)._M_dataplus._M_p = (pointer)&(this->cmd_id_).field_2;
  pcVar1 = (cmd->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + cmd->_M_string_length);
  (this->cmd_)._M_dataplus._M_p = (pointer)&(this->cmd_).field_2;
  pcVar1 = (cmd->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->cmd_,pcVar1,pcVar1 + cmd->_M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->extraArgs_,extraArgs,&local_19);
  this->includeFiles_ = false;
  return;
}

Assistant:

Command(std::string cmd, const char *extraArgs)
      : cmd_id_(cmd), cmd_(cmd), extraArgs_(extraArgs) {}